

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O3

int glslang::TIntermediate::getScalarAlignment(TType *type,int *size,int *stride,bool rowMajor)

{
  TTypeList *pTVar1;
  int iVar2;
  int powerOf2;
  int iVar3;
  pointer pTVar4;
  long lVar5;
  bool rowMajor_00;
  long lVar6;
  ulong uVar7;
  int dummyStride;
  TType derefType;
  int local_cc;
  TType local_c8;
  
  *stride = 0;
  iVar2 = (*type->_vptr_TType[0x1d])();
  if ((char)iVar2 == '\0') {
    iVar2 = (*type->_vptr_TType[7])(type);
    if (iVar2 == 0xf) {
      iVar2 = (*type->_vptr_TType[0x25])();
      if ((char)iVar2 == '\0') {
        __assert_fail("isStruct()",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                      ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
      }
      pTVar1 = (type->field_13).structure;
      *size = 0;
      pTVar4 = (pTVar1->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
               ).super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((pTVar1->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
          super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl
          .super__Vector_impl_data._M_finish == pTVar4) {
        powerOf2 = 0;
      }
      else {
        lVar6 = 0;
        uVar7 = 0;
        powerOf2 = 0;
        do {
          lVar5 = (**(code **)(**(long **)((long)&pTVar4->type + lVar6) + 0x50))();
          rowMajor_00 = (*(ulong *)(lVar5 + 8) & 0xe000000000000000) == 0x2000000000000000;
          if (*(ulong *)(lVar5 + 8) < 0x2000000000000000) {
            rowMajor_00 = rowMajor;
          }
          iVar2 = getScalarAlignment(*(TType **)
                                      ((long)&((pTVar1->
                                               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                               ).
                                               super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->type +
                                      lVar6),(int *)&local_c8,&local_cc,rowMajor_00);
          if (powerOf2 <= iVar2) {
            powerOf2 = iVar2;
          }
          RoundToPow2<int>(size,iVar2);
          *size = *size + (int)local_c8._vptr_TType;
          uVar7 = uVar7 + 1;
          pTVar4 = (pTVar1->
                   super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                   super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar6 = lVar6 + 0x20;
        } while (uVar7 < (ulong)((long)(pTVar1->
                                       super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                       ).
                                       super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar4 >>
                                5));
      }
    }
    else {
      iVar2 = (*type->_vptr_TType[0x18])(type);
      if ((char)iVar2 != '\0') {
        iVar2 = getBaseAlignmentScalar(type,size);
        return iVar2;
      }
      iVar2 = (*type->_vptr_TType[0x1b])(type);
      if ((char)iVar2 == '\0') {
        iVar2 = (*type->_vptr_TType[0x1c])(type);
        if ((char)iVar2 == '\0') {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/linkValidate.cpp"
                        ,0x97d,
                        "static int glslang::TIntermediate::getScalarAlignment(const TType &, int &, int &, bool)"
                       );
        }
        TType::TType(&local_c8,type,0,rowMajor);
        powerOf2 = getScalarAlignment(&local_c8,size,&local_cc,rowMajor);
        iVar2 = *size;
        *stride = iVar2;
        iVar3 = (*type->_vptr_TType[(ulong)rowMajor + 0xd])(type);
        iVar3 = iVar3 * iVar2;
      }
      else {
        powerOf2 = getBaseAlignmentScalar(type,size);
        iVar3 = (*type->_vptr_TType[0xc])(type);
        iVar3 = iVar3 * *size;
      }
      *size = iVar3;
    }
  }
  else {
    TType::TType(&local_c8,type,0,false);
    powerOf2 = getScalarAlignment(&local_c8,size,&local_cc,rowMajor);
    *stride = *size;
    RoundToPow2<int>(stride,powerOf2);
    iVar2 = *stride;
    iVar3 = (*type->_vptr_TType[0xf])(type);
    *size = *size + (iVar3 + -1) * iVar2;
  }
  return powerOf2;
}

Assistant:

int TIntermediate::getScalarAlignment(const TType& type, int& size, int& stride, bool rowMajor)
{
    int alignment;

    stride = 0;
    int dummyStride;

    if (type.isArray()) {
        TType derefType(type, 0);
        alignment = getScalarAlignment(derefType, size, dummyStride, rowMajor);

        stride = size;
        RoundToPow2(stride, alignment);

        size = stride * (type.getOuterArraySize() - 1) + size;
        return alignment;
    }

    if (type.getBasicType() == EbtStruct) {
        const TTypeList& memberList = *type.getStruct();

        size = 0;
        int maxAlignment = 0;
        for (size_t m = 0; m < memberList.size(); ++m) {
            int memberSize;
            // modify just the children's view of matrix layout, if there is one for this member
            TLayoutMatrix subMatrixLayout = memberList[m].type->getQualifier().layoutMatrix;
            int memberAlignment = getScalarAlignment(*memberList[m].type, memberSize, dummyStride,
                                                     (subMatrixLayout != ElmNone) ? (subMatrixLayout == ElmRowMajor) : rowMajor);
            maxAlignment = std::max(maxAlignment, memberAlignment);
            RoundToPow2(size, memberAlignment);
            size += memberSize;
        }

        return maxAlignment;
    }

    if (type.isScalar())
        return getBaseAlignmentScalar(type, size);

    if (type.isVector()) {
        int scalarAlign = getBaseAlignmentScalar(type, size);

        size *= type.getVectorSize();
        return scalarAlign;
    }

    if (type.isMatrix()) {
        TType derefType(type, 0, rowMajor);

        alignment = getScalarAlignment(derefType, size, dummyStride, rowMajor);

        stride = size;  // use intra-matrix stride for stride of a just a matrix
        if (rowMajor)
            size = stride * type.getMatrixRows();
        else
            size = stride * type.getMatrixCols();

        return alignment;
    }

    assert(0);  // all cases should be covered above
    size = 1;
    return 1;
}